

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::mul(Simulator *this,PCode *code)

{
  Type TVar1;
  reference pvVar2;
  int *piVar3;
  double *pdVar4;
  simulator_error *psVar5;
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  StackSymbol local_160;
  undefined1 local_112;
  allocator local_111;
  string local_110;
  int local_f0;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8;
  int local_c4;
  double local_c0;
  double result;
  undefined1 local_a8 [8];
  StackSymbol second;
  StackSymbol first;
  PCode *code_local;
  Simulator *this_local;
  
  this_00 = &this->stack_;
  pvVar2 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(this_00);
  StackSymbol::StackSymbol
            ((StackSymbol *)
             &second.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar2);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pvVar2 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(this_00);
  StackSymbol::StackSymbol((StackSymbol *)local_a8,pvVar2);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  TVar1 = StackSymbol::type((StackSymbol *)local_a8);
  if (TVar1 == kInt) {
    piVar3 = StackSymbol::int_value((StackSymbol *)local_a8);
    local_c0 = (double)*piVar3;
  }
  else {
    TVar1 = StackSymbol::type((StackSymbol *)local_a8);
    if (TVar1 != kReal) {
      local_ea = 1;
      psVar5 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_c4 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,anon_var_dwarf_a270,&local_e9);
      simulator_error::simulator_error(psVar5,&local_c4,&local_e8);
      local_ea = 0;
      __cxa_throw(psVar5,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    pdVar4 = StackSymbol::real_value((StackSymbol *)local_a8);
    local_c0 = *pdVar4;
  }
  TVar1 = StackSymbol::type((StackSymbol *)
                            &second.value_.real_array.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  if (TVar1 == kInt) {
    piVar3 = StackSymbol::int_value
                       ((StackSymbol *)
                        &second.value_.real_array.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_c0 = (double)*piVar3 * local_c0;
  }
  else {
    TVar1 = StackSymbol::type((StackSymbol *)
                              &second.value_.real_array.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    if (TVar1 != kReal) {
      local_112 = 1;
      psVar5 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_f0 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,anon_var_dwarf_a270,&local_111);
      simulator_error::simulator_error(psVar5,&local_f0,&local_110);
      local_112 = 0;
      __cxa_throw(psVar5,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    pdVar4 = StackSymbol::real_value
                       ((StackSymbol *)
                        &second.value_.real_array.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_c0 = *pdVar4 * local_c0;
  }
  StackSymbol::StackSymbol(&local_160,&local_c0);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_160);
  StackSymbol::~StackSymbol(&local_160);
  inc_eip(this);
  StackSymbol::~StackSymbol((StackSymbol *)local_a8);
  StackSymbol::~StackSymbol
            ((StackSymbol *)
             &second.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Simulator::mul(const PCode &code) {
    StackSymbol first = stack_.back();
    stack_.pop_back();
    StackSymbol second = stack_.back();
    stack_.pop_back();

    double result;
    if (second.type() == StackSymbol::Type::kInt) {
        result = second.int_value();
    } else if (second.type() == StackSymbol::Type::kReal) {
        result = second.real_value();
    } else {
        throw simulator_error(eip(), "不合法的乘法操作数");
    }
    if (first.type() == StackSymbol::Type::kInt) {
        result *= first.int_value();
    } else if (first.type() == StackSymbol::Type::kReal) {
        result *= first.real_value();
    } else {
        throw simulator_error(eip(), "不合法的乘法操作数");
    }

    stack_.push_back(StackSymbol(result));
    inc_eip();
}